

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O3

void __thiscall
prevector_tests::prevector_tester<8U,_int>::resize_uninitialized
          (prevector_tester<8U,_int> *this,realtype values)

{
  pretype *this_00;
  ulong __n;
  pointer piVar1;
  int *piVar2;
  iterator __position;
  undefined4 *puVar3;
  int iVar4;
  uint uVar5;
  size_type sVar6;
  undefined4 *puVar7;
  uint uVar8;
  pretype *ppVar9;
  uint new_capacity;
  int *piVar10;
  long *in_RSI;
  uint uVar11;
  ulong __new_size;
  long lVar12;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar12 = in_RSI[1] - *in_RSI >> 2;
  piVar1 = (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = (ulong)((long)(this->real_vector).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2) >> 1;
  __n = __new_size + lVar12;
  if ((ulong)((long)(this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage - (long)piVar1 >> 2) < __n) {
    std::vector<int,_std::allocator<int>_>::reserve(&this->real_vector,__n);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->real_vector,__new_size);
  uVar5 = (this->pre_vector)._size;
  uVar8 = 8;
  if (8 < uVar5) {
    uVar8 = (this->pre_vector)._union.indirect_contents.capacity;
  }
  this_00 = &this->pre_vector;
  uVar11 = (uint)__new_size;
  if (uVar8 < uVar11) {
    prevector<8U,_int,_unsigned_int,_int>::change_capacity(this_00,uVar11);
    uVar5 = (this->pre_vector)._size;
    uVar8 = uVar5 - 9;
    if (uVar5 < 9) {
      uVar8 = uVar5;
    }
  }
  else {
    uVar8 = uVar5 - 9;
    if (uVar5 < 9) {
      uVar8 = uVar5;
    }
    if (uVar11 < uVar8) {
      sVar6 = (uVar11 - uVar8) + uVar5;
      goto LAB_00528111;
    }
  }
  sVar6 = (uVar5 + uVar11) - uVar8;
LAB_00528111:
  (this->pre_vector)._size = sVar6;
  piVar10 = (int *)*in_RSI;
  piVar2 = (int *)in_RSI[1];
  if (piVar10 != piVar2) {
    do {
      local_3c = *piVar10;
      __position._M_current =
           (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)this,__position,&local_3c);
      }
      else {
        *__position._M_current = local_3c;
        (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      piVar10 = piVar10 + 1;
    } while (piVar10 != piVar2);
  }
  uVar5 = (this->pre_vector)._size;
  uVar11 = uVar5 - 9;
  uVar8 = (this->pre_vector)._union.indirect_contents.capacity;
  if (uVar5 < 9) {
    uVar11 = uVar5;
    uVar8 = 8;
  }
  iVar4 = (int)lVar12;
  new_capacity = uVar11 + iVar4;
  if (uVar8 < new_capacity) {
    prevector<8U,_int,_unsigned_int,_int>::change_capacity(this_00,new_capacity);
    uVar5 = (this->pre_vector)._size;
    uVar8 = uVar5 - 9;
    if (uVar5 < 9) {
      uVar8 = uVar5;
    }
    sVar6 = (uVar5 + new_capacity) - uVar8;
  }
  else {
    sVar6 = uVar5 + iVar4;
  }
  (this->pre_vector)._size = sVar6;
  puVar3 = (undefined4 *)in_RSI[1];
  for (puVar7 = (undefined4 *)*in_RSI; puVar7 != puVar3; puVar7 = puVar7 + 1) {
    ppVar9 = this_00;
    if (8 < (this->pre_vector)._size) {
      ppVar9 = (pretype *)(this->pre_vector)._union.indirect_contents.indirect;
    }
    *(undefined4 *)((long)&ppVar9->_union + (long)(int)uVar11 * 4) = *puVar7;
    uVar11 = uVar11 + 1;
  }
  test(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize_uninitialized(realtype values) {
        size_t r = values.size();
        size_t s = real_vector.size() / 2;
        if (real_vector.capacity() < s + r) {
            real_vector.reserve(s + r);
        }
        real_vector.resize(s);
        pre_vector.resize_uninitialized(s);
        for (auto v : values) {
            real_vector.push_back(v);
        }
        auto p = pre_vector.size();
        pre_vector.resize_uninitialized(p + r);
        for (auto v : values) {
            pre_vector[p] = v;
            ++p;
        }
        test();
    }